

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<char_const(&)[45],kj::CappedArray<char,17ul>&,char_const(&)[8],kj::Array<kj::StringTree>,char_const(&)[4]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [45],
          CappedArray<char,_17UL> *params_1,char (*params_2) [8],Array<kj::StringTree> *params_3,
          char (*params_4) [4])

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  StringPtr delim;
  ArrayPtr<const_char> *in_stack_ffffffffffffff48;
  StringTree local_a8;
  undefined1 local_70 [24];
  ArrayDisposer *local_58;
  ArrayPtr<const_char> local_50;
  kj *local_40;
  char *local_38;
  
  local_38 = (char *)strlen((char *)this);
  local_50.size_ = *(size_t *)*params;
  local_50.ptr = *params + 8;
  local_40 = this;
  local_58 = (ArrayDisposer *)strlen((char *)params_1);
  delim.content.size_ = 1;
  delim.content.ptr = "";
  local_70._16_8_ = params_1;
  StringTree::StringTree(&local_a8,(Array<kj::StringTree> *)params_2,delim);
  local_70._8_8_ = strlen((char *)params_3);
  local_70._0_8_ = params_3;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,&local_50,
             (ArrayPtr<const_char> *)(local_70 + 0x10),(ArrayPtr<const_char> *)&local_a8,
             (StringTree *)local_70,in_stack_ffffffffffffff48);
  sVar2 = local_a8.branches.size_;
  pBVar3 = local_a8.branches.ptr;
  if (local_a8.branches.ptr != (Branch *)0x0) {
    local_a8.branches.ptr = (Branch *)0x0;
    local_a8.branches.size_ = 0;
    (**(local_a8.branches.disposer)->_vptr_ArrayDisposer)
              (local_a8.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_a8.text.content.size_;
  pcVar1 = local_a8.text.content.ptr;
  if (local_a8.text.content.ptr != (char *)0x0) {
    local_a8.text.content.ptr = (char *)0x0;
    local_a8.text.content.size_ = 0;
    (**(local_a8.text.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}